

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer_EveryoneWrites_Async.cpp
# Opt level: O0

ComputationStatus
adios2::core::engine::BP5Writer::IsInComputationBlock(AsyncWriteInfo *info,size_t *compBlockIdx)

{
  byte bVar1;
  ulong uVar2;
  Spinlock *this;
  reference pvVar3;
  ulong *in_RSI;
  long in_RDI;
  bool bVar4;
  size_t compBlockID;
  bool inComp;
  size_t nExpectedBlocks;
  ComputationStatus compStatus;
  ComputationStatus local_14;
  
  local_14 = NotInComp_ExpectMore;
  this = (Spinlock *)
         std::
         vector<adios2::core::engine::BP5Writer::ComputationBlockInfo,_std::allocator<adios2::core::engine::BP5Writer::ComputationBlockInfo>_>
         ::size((vector<adios2::core::engine::BP5Writer::ComputationBlockInfo,_std::allocator<adios2::core::engine::BP5Writer::ComputationBlockInfo>_>
                 *)(in_RDI + 0x70));
  if ((Spinlock *)*in_RSI < this) {
    shm::Spinlock::lock(this);
    uVar2 = **(ulong **)(in_RDI + 0x90);
    bVar1 = **(byte **)(in_RDI + 0x60);
    shm::Spinlock::unlock(this);
    if ((bVar1 & 1) != 0) {
      while( true ) {
        bVar4 = false;
        if ((Spinlock *)*in_RSI < this) {
          pvVar3 = std::
                   vector<adios2::core::engine::BP5Writer::ComputationBlockInfo,_std::allocator<adios2::core::engine::BP5Writer::ComputationBlockInfo>_>
                   ::operator[]((vector<adios2::core::engine::BP5Writer::ComputationBlockInfo,_std::allocator<adios2::core::engine::BP5Writer::ComputationBlockInfo>_>
                                 *)(in_RDI + 0x70),*in_RSI);
          bVar4 = pvVar3->blockID < uVar2;
        }
        if (!bVar4) break;
        *in_RSI = *in_RSI + 1;
      }
      pvVar3 = std::
               vector<adios2::core::engine::BP5Writer::ComputationBlockInfo,_std::allocator<adios2::core::engine::BP5Writer::ComputationBlockInfo>_>
               ::operator[]((vector<adios2::core::engine::BP5Writer::ComputationBlockInfo,_std::allocator<adios2::core::engine::BP5Writer::ComputationBlockInfo>_>
                             *)(in_RDI + 0x70),*in_RSI);
      local_14 = (ComputationStatus)(uVar2 < pvVar3->blockID);
    }
  }
  else {
    local_14 = NoMoreComp;
  }
  return local_14;
}

Assistant:

BP5Writer::ComputationStatus BP5Writer::IsInComputationBlock(AsyncWriteInfo *info,
                                                             size_t &compBlockIdx)
{
    ComputationStatus compStatus = ComputationStatus::NotInComp_ExpectMore;
    size_t nExpectedBlocks = info->expectedComputationBlocks.size();

    if (compBlockIdx >= nExpectedBlocks)
    {
        compStatus = ComputationStatus::NoMoreComp;
    }
    else
    {
        bool inComp = false;
        size_t compBlockID = 0;
        // access variables modified by main thread to avoid data race
        info->lock->lock();
        compBlockID = *info->currentComputationBlockID;
        inComp = *info->inComputationBlock;
        info->lock->unlock();

        /* Track which computation block we are in */
        if (inComp)
        {
            while (compBlockIdx < nExpectedBlocks &&
                   info->expectedComputationBlocks[compBlockIdx].blockID < compBlockID)
            {
                ++compBlockIdx;
            }
            if (info->expectedComputationBlocks[compBlockIdx].blockID > compBlockID)
            {
                // the current computation block is a short one that was not
                // recorded
                compStatus = ComputationStatus::NotInComp_ExpectMore;
            }
            else
            {
                compStatus = ComputationStatus::InComp;
            }
        }
    }
    return compStatus;
}